

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O2

CONCRETE_IO_HANDLE socketio_create(void *io_create_parameters)

{
  SOCKET_IO_INSTANCE *instance;
  SINGLYLINKEDLIST_HANDLE pSVar1;
  size_t sVar2;
  char *__dest;
  LOGGER_LOG p_Var3;
  DNSRESOLVER_HANDLE pvVar4;
  int iVar5;
  size_t __size;
  char *pcVar6;
  
  if (io_create_parameters == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (CONCRETE_IO_HANDLE)0x0;
    }
    pcVar6 = "Invalid argument: socket_io_config is NULL";
    iVar5 = 0x2e9;
LAB_00169db7:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
              ,"socketio_create",iVar5,1,pcVar6);
    return (CONCRETE_IO_HANDLE)0x0;
  }
  instance = (SOCKET_IO_INSTANCE *)calloc(1,0xa8);
  if (instance == (SOCKET_IO_INSTANCE *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (CONCRETE_IO_HANDLE)0x0;
    }
    pcVar6 = "Allocation Failure: SOCKET_IO_INSTANCE";
    iVar5 = 0x32c;
    goto LAB_00169db7;
  }
  pSVar1 = singlylinkedlist_create();
  instance->pending_io_list = pSVar1;
  if (pSVar1 == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00169e88;
    pcVar6 = "Failure: singlylinkedlist_create unable to create pending list.";
    iVar5 = 0x2f7;
  }
  else {
    pcVar6 = *io_create_parameters;
    if (pcVar6 == (char *)0x0) {
      instance->hostname = (char *)0x0;
      iVar5 = **(int **)((long)io_create_parameters + 0x10);
LAB_00169e3e:
      __dest = (char *)0x0;
    }
    else {
      sVar2 = strlen(pcVar6);
      __size = 0xffffffffffffffff;
      if (sVar2 + 1 != 0) {
        __size = sVar2 + 1;
      }
      if (__size == 0xffffffffffffffff) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
                    ,"socketio_create",0x302,1,"invalid malloc size");
        }
        instance->hostname = (char *)0x0;
        iVar5 = -1;
        goto LAB_00169e3e;
      }
      __dest = (char *)malloc(__size);
      instance->hostname = __dest;
      iVar5 = -1;
      if (__dest == (char *)0x0) goto LAB_00169e3e;
      strcpy(__dest,pcVar6);
    }
    instance->socket = iVar5;
    if (iVar5 != -1 || __dest != (char *)0x0) {
      iVar5 = *(int *)((long)io_create_parameters + 8);
      instance->port = iVar5;
      instance->on_io_open_complete = (ON_IO_OPEN_COMPLETE)0x0;
      pvVar4 = dns_resolver_create(__dest,iVar5,(DNSRESOLVER_OPTIONS *)0x0);
      instance->dns_resolver = pvVar4;
      instance->target_mac_address = (char *)0x0;
      instance->io_state = IO_STATE_CLOSED;
      instance->on_bytes_received = (ON_BYTES_RECEIVED)0x0;
      instance->on_io_error = (ON_IO_ERROR)0x0;
      instance->on_bytes_received_context = (void *)0x0;
      instance->on_io_error_context = (void *)0x0;
      return instance;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00169e88;
    pcVar6 = "Failure: hostname == NULL and socket is invalid.";
    iVar5 = 0x318;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/socketio_berkeley.c"
            ,"socketio_create",iVar5,1,pcVar6);
LAB_00169e88:
  destroy_socket_io_instance(instance);
  return (CONCRETE_IO_HANDLE)0x0;
}

Assistant:

CONCRETE_IO_HANDLE socketio_create(void* io_create_parameters)
{
    SOCKETIO_CONFIG* socket_io_config = io_create_parameters;
    SOCKET_IO_INSTANCE* result;

    if (socket_io_config == NULL)
    {
        LogError("Invalid argument: socket_io_config is NULL");
        result = NULL;
    }
    else
    {
        result = malloc(sizeof(SOCKET_IO_INSTANCE));
        if (result != NULL)
        {
            (void)memset(result, 0, sizeof(SOCKET_IO_INSTANCE));

            result->address_type = ADDRESS_TYPE_IP;
            result->pending_io_list = singlylinkedlist_create();
            if (result->pending_io_list == NULL)
            {
                LogError("Failure: singlylinkedlist_create unable to create pending list.");
                destroy_socket_io_instance(result);
                result = NULL;
            }
            else
            {
                if (socket_io_config->hostname != NULL)
                {
                    size_t malloc_size = safe_add_size_t(strlen(socket_io_config->hostname), 1);
                    if (malloc_size == SIZE_MAX)
                    {
                        LogError("invalid malloc size");
                        result->hostname = NULL;
                    }
                    else
                    {
                        result->hostname = (char*)malloc(malloc_size);
                        if (result->hostname != NULL)
                        {
                            (void)strcpy(result->hostname, socket_io_config->hostname);
                        }
                    }

                    result->socket = INVALID_SOCKET;
                }
                else
                {
                    result->hostname = NULL;
                    result->socket = *((int*)socket_io_config->accepted_socket);
                }

                if ((result->hostname == NULL) && (result->socket == INVALID_SOCKET))
                {
                    LogError("Failure: hostname == NULL and socket is invalid.");
                    destroy_socket_io_instance(result);
                    result = NULL;
                }
                else
                {
                    result->port = socket_io_config->port;
                    result->on_io_open_complete = NULL;
                    result->dns_resolver = dns_resolver_create(result->hostname, socket_io_config->port, NULL);
                    result->target_mac_address = NULL;
                    result->on_bytes_received = NULL;
                    result->on_io_error = NULL;
                    result->on_bytes_received_context = NULL;
                    result->on_io_error_context = NULL;
                    result->io_state = IO_STATE_CLOSED;
                }
            }
        }
        else
        {
            LogError("Allocation Failure: SOCKET_IO_INSTANCE");
        }
    }

    return result;
}